

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O3

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLiFloat
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  undefined4 in_register_0000000c;
  uint in_R8D;
  long *plVar1;
  long lVar2;
  initializer_list<AssemblyTemplateArgument> variables;
  string macroText;
  string local_98;
  char *local_78;
  string local_70;
  char *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  preprocessMacro_abi_cxx11_
            (&local_98,"\n\t\tli \t\tr1,float(%imm%)\n\t\tmtc1\tr1,%rs%\n\t",
             (MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_78 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_70,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  local_50 = "%rs%";
  plVar1 = local_38;
  lVar2 = *(long *)&immediates[1].secondary.value;
  local_48[0] = plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,lVar2,*(long *)&immediates[2].primary + lVar2);
  variables._M_array = (iterator)(ulong)in_R8D;
  variables._M_len = (size_type)&local_78;
  createMacro(parser,(string *)registers,(int)&local_98,variables);
  lVar2 = -0x50;
  do {
    if (plVar1 != (long *)plVar1[-2]) {
      operator_delete((long *)plVar1[-2],*plVar1 + 1);
    }
    plVar1 = plVar1 + -5;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLiFloat(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLiFloat = R"(
		li 		r1,float(%imm%)
		mtc1	r1,%rs%
	)";

	std::string macroText = preprocessMacro(templateLiFloat,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%imm%",		immediates.secondary.expression.toString() },
			{ "%rs%",		registers.frs.name.string() },
	});
}